

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtGImpactCollisionAlgorithm::convex_vs_convex_collision
          (cbtGImpactCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtCollisionShape *shape0,cbtCollisionShape *shape1)

{
  ulong uVar1;
  ulong uVar3;
  cbtPersistentManifold *pcVar5;
  cbtDispatcher *pcVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cbtCollisionObjectWrapper ob1;
  cbtCollisionObjectWrapper ob0;
  cbtCollisionObjectWrapper *local_78;
  cbtCollisionShape *local_70;
  cbtCollisionObject *local_68;
  cbtTransform *local_60;
  ulong local_58;
  cbtCollisionObjectWrapper *local_50;
  cbtCollisionShape *local_48;
  cbtCollisionObject *local_40;
  cbtTransform *local_38;
  ulong local_30;
  long lVar2;
  long lVar4;
  
  (*(this->m_resultOut->super_Result)._vptr_Result[2])
            (this->m_resultOut,(ulong)(uint)this->m_part0,(ulong)(uint)this->m_triface0);
  (*(this->m_resultOut->super_Result)._vptr_Result[3])
            (this->m_resultOut,(ulong)(uint)this->m_part1,(ulong)(uint)this->m_triface1);
  local_40 = body0Wrap->m_collisionObject;
  local_38 = body0Wrap->m_worldTransform;
  uVar1._0_4_ = this->m_triface0;
  uVar1._4_4_ = this->m_part0;
  lVar2._0_4_ = this->m_triface0;
  lVar2._4_4_ = this->m_part0;
  local_30 = uVar1 >> 0x20 | lVar2 << 0x20;
  local_68 = body1Wrap->m_collisionObject;
  local_60 = body1Wrap->m_worldTransform;
  uVar3._0_4_ = this->m_triface1;
  uVar3._4_4_ = this->m_part1;
  lVar4._0_4_ = this->m_triface1;
  lVar4._4_4_ = this->m_part1;
  local_58 = uVar3 >> 0x20 | lVar4 << 0x20;
  local_78 = body1Wrap;
  local_70 = shape1;
  local_50 = body0Wrap;
  local_48 = shape0;
  if (this->m_convex_algorithm == (cbtCollisionAlgorithm *)0x0) {
    if (this->m_manifoldPtr == (cbtPersistentManifold *)0x0) {
      iVar7 = (*((this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
                m_dispatcher)->_vptr_cbtDispatcher[3])();
      this->m_manifoldPtr = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar7);
    }
    pcVar5 = this->m_manifoldPtr;
    this->m_resultOut->m_manifoldPtr = pcVar5;
    pcVar6 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.m_dispatcher;
    iVar7 = (*pcVar6->_vptr_cbtDispatcher[2])(pcVar6,&local_50,&local_78,pcVar5,1);
    this->m_convex_algorithm = (cbtCollisionAlgorithm *)CONCAT44(extraout_var_00,iVar7);
  }
  (*this->m_convex_algorithm->_vptr_cbtCollisionAlgorithm[2])
            (this->m_convex_algorithm,&local_50,&local_78,this->m_dispatchInfo,this->m_resultOut);
  return;
}

Assistant:

void cbtGImpactCollisionAlgorithm::convex_vs_convex_collision(
	const cbtCollisionObjectWrapper* body0Wrap,
	const cbtCollisionObjectWrapper* body1Wrap,
	const cbtCollisionShape* shape0,
	const cbtCollisionShape* shape1)
{
	m_resultOut->setShapeIdentifiersA(m_part0, m_triface0);
	m_resultOut->setShapeIdentifiersB(m_part1, m_triface1);

	cbtCollisionObjectWrapper ob0(body0Wrap, shape0, body0Wrap->getCollisionObject(), body0Wrap->getWorldTransform(), m_part0, m_triface0);
	cbtCollisionObjectWrapper ob1(body1Wrap, shape1, body1Wrap->getCollisionObject(), body1Wrap->getWorldTransform(), m_part1, m_triface1);
	checkConvexAlgorithm(&ob0, &ob1);
	m_convex_algorithm->processCollision(&ob0, &ob1, *m_dispatchInfo, m_resultOut);
}